

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int str_to_label(char *dest,char *host,uint maxlen)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  bool bVar9;
  
  sVar2 = strlen(host);
  uVar4 = (uint)sVar2;
  bVar9 = 0 < (int)uVar4;
  uVar3 = 0;
  if (maxlen < 2 || (int)uVar4 < 1) {
    uVar4 = 1;
    cVar7 = '\0';
  }
  else {
    uVar8 = maxlen - 2;
    if (uVar4 - 1 < maxlen - 2) {
      uVar8 = uVar4 - 1;
    }
    uVar6 = 0;
    uVar1 = 0;
    do {
      if (host[uVar6] == '.') {
        dest[uVar1] = (char)uVar3;
        uVar1 = (int)uVar6 + 1;
        uVar3 = 0;
      }
      else {
        dest[uVar6 + 1] = host[uVar6];
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 + 1 != uVar6);
    bVar9 = uVar6 < (uVar4 & 0x7fffffff);
    uVar4 = (int)uVar6 + 1;
    cVar7 = (char)uVar3;
    uVar3 = (ulong)uVar1;
  }
  iVar5 = -1;
  if (!bVar9) {
    dest[uVar3] = cVar7;
    dest[uVar4] = '\0';
    iVar5 = uVar4 + 1;
  }
  return iVar5;
}

Assistant:

int str_to_label(char *dest, const char *host, unsigned maxlen) {
  /*
  用于把域名转化成DNS格式
  例如   host = www.bupt.edu.cn
  转化为 host = \x1www\x4bupt\x3edu\x2cn\x0
  */
  int n = strlen(host);
  unsigned last_pos = 0, cumulate = 0;
  int i, j = 1; //空出第一格
  for (i = 0; i < n && j < maxlen; i++, j++) {
    if (host[i] == '.') {
      dest[last_pos] = cumulate;
      cumulate = 0;
      last_pos = j;
    } else {
      dest[j] = host[i];
      cumulate++;
    }
  }
  if (i < n)
    return -1;
  dest[last_pos] = cumulate;
  dest[j] = 0;
  return j + 1;
}